

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O1

void __thiscall YAML::Scanner::StartStream(Scanner *this)

{
  iterator *piVar1;
  _Elt_pointer ppIVar2;
  pointer *__ptr;
  unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_> pIndent
  ;
  _Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false> local_18;
  _Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false> local_10;
  
  this->m_startedStream = true;
  this->m_simpleKeyAllowed = true;
  local_18._M_head_impl = (IndentMarker *)operator_new(0x18);
  (local_18._M_head_impl)->column = -1;
  (local_18._M_head_impl)->type = NONE;
  (local_18._M_head_impl)->status = VALID;
  (local_18._M_head_impl)->pStartToken = (Token *)0x0;
  std::
  vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
  ::
  emplace_back<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>
            ((vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
              *)&this->m_indentRefs,
             (unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
              *)&local_18);
  local_10._M_head_impl =
       (this->m_indentRefs).m_data.
       super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
       ._M_t.
       super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
       .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl;
  ppIVar2 = (this->m_indents).c.
            super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppIVar2 ==
      (this->m_indents).c.
      super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>::
    _M_push_back_aux<YAML::Scanner::IndentMarker*>
              ((deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>> *)
               &this->m_indents,&local_10._M_head_impl);
  }
  else {
    *ppIVar2 = local_10._M_head_impl;
    piVar1 = &(this->m_indents).c.
              super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_18._M_head_impl != (IndentMarker *)0x0) {
    operator_delete(local_18._M_head_impl);
  }
  return;
}

Assistant:

void Scanner::StartStream() {
  m_startedStream = true;
  m_simpleKeyAllowed = true;
  std::unique_ptr<IndentMarker> pIndent(
      new IndentMarker(-1, IndentMarker::NONE));
  m_indentRefs.push_back(std::move(pIndent));
  m_indents.push(&m_indentRefs.back());
}